

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O0

void __thiscall
indigox::algorithm::AStarOptimisation::GenerateNeighbourDistributions
          (AStarOptimisation *this,p_AStarQueueItem *d,
          vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *out_nbrs)

{
  uint uVar1;
  element_type *peVar2;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  uint8_t j;
  ElnDist nbr;
  uint8_t i;
  uint in_stack_ffffffffffffff98;
  value_type *in_stack_ffffffffffffffa8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  byte local_41;
  byte local_19;
  
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)0x13cb92);
  local_19 = 0;
  while( true ) {
    uVar1 = (uint)local_19;
    peVar2 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13cbaa);
    if ((int)(uint)peVar2->nbr_count < (int)uVar1) break;
    std::
    __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x13cbca);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              (in_RSI,(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                      CONCAT44(uVar1,in_stack_ffffffffffffff98));
    for (local_41 = 0; local_41 < local_19; local_41 = local_41 + 1) {
      in_stack_ffffffffffffff98 = (uint)local_41;
      std::
      __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x13cbfc);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8,
                 SUB81((ulong)in_RSI >> 0x38,0));
    }
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x13cc61);
    local_19 = local_19 + 1;
  }
  return;
}

Assistant:

void AStarOptimisation::GenerateNeighbourDistributions(p_AStarQueueItem d, std::vector<ElnDist> *out_nbrs) {
  out_nbrs->clear();
  for (uint8_t i = 0; i <= d->nbr_count; ++i) {
    ElnDist nbr = ElnDist(d->distribution);
    for (uint8_t j = 0; j < i; ++j) {
      nbr.set(j + d->nbr_start_idx);
    }
    out_nbrs->push_back(nbr);
  }
}